

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeIncludes
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  string *psVar2;
  string local_170;
  undefined1 local_149;
  char *local_148;
  char *cincludes;
  undefined1 local_138 [8];
  string INCLUDE_DIRECTORIES;
  string local_f8;
  undefined1 local_d8 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  undefined1 local_60 [8];
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *includesString;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&config.field_2 + 8));
  psVar2 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalCommonGenerator);
  std::__cxx11::string::string((string *)local_60,(string *)psVar2);
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_f8,(string *)local_60);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string
            ((string *)(INCLUDE_DIRECTORIES.field_2._M_local_buf + 8),(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_d8,(cmLocalGenerator *)pcVar1,&local_f8,
             headTarget,(string *)((long)&INCLUDE_DIRECTORIES.field_2 + 8));
  std::__cxx11::string::~string((string *)(INCLUDE_DIRECTORIES.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"INCLUDE_DIRECTORIES",(allocator<char> *)((long)&cincludes + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cincludes + 7));
  local_148 = cmSourceFile::GetProperty(source,(string *)local_138);
  if (local_148 != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_d8,local_148,(string *)local_138);
    cmLocalGenerator::AppendIncludeDirectories
              ((cmLocalGenerator *)pcVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&config.field_2 + 8),psVar2,source);
  }
  local_149 = 0;
  cmLocalGenerator::GetIncludeFlags
            (__return_storage_ptr__,(cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&config.field_2 + 8),(this->super_cmCommonTargetGenerator).GeneratorTarget,
             language,true,false,(string *)local_60);
  pcVar1 = this->LocalGenerator;
  cmCommonTargetGenerator::GetIncludes(&local_170,&this->super_cmCommonTargetGenerator,language);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,__return_storage_ptr__,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  local_149 = 1;
  std::__cxx11::string::~string((string *)local_138);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_d8);
  std::__cxx11::string::~string((string *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&config.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeIncludes(
  cmSourceFile const* source, const std::string& language)
{
  std::vector<std::string> includes;
  const std::string config = this->LocalGenerator->GetConfigName();
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (const char* cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    this->LocalGenerator->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  std::string includesString = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language, true, false, config);
  this->LocalGenerator->AppendFlags(includesString,
                                    this->GetIncludes(language));

  return includesString;
}